

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsPath(gdsForge *this,gdsPATH *in_PATH,bool minimal)

{
  pointer piVar1;
  pointer piVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  pointer piVar7;
  int cnt;
  undefined8 uStack_70;
  int aiStack_68 [2];
  string local_60;
  undefined1 *local_40;
  int local_38;
  uint local_34 [2];
  int data [1];
  
  local_40 = (undefined1 *)aiStack_68;
  lVar4 = -(((long)(in_PATH->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(in_PATH->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) * 2 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cc9d;
  GDSwriteRec(this,0x900);
  local_38 = (int)CONCAT71(in_register_00000011,minimal);
  if (local_38 == 0) {
    local_34[0] = in_PATH->plex;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
    uVar3 = *(undefined8 *)((long)&uStack_70 + lVar4);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10ccbf;
    GDSwriteInt(this,0x2f03,(int *)local_34,(int)uVar3);
  }
  local_34[0] = in_PATH->layer;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
  cnt = (int)*(undefined8 *)((long)&uStack_70 + lVar4);
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cce2;
  GDSwriteInt(this,0xd02,(int *)local_34,cnt);
  local_34[0] = in_PATH->dataType;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10ccfd;
  GDSwriteInt(this,0xe02,(int *)local_34,cnt);
  local_34[0] = in_PATH->pathtype;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cd18;
  GDSwriteInt(this,0x2102,(int *)local_34,cnt);
  local_34[0] = in_PATH->width;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cd33;
  GDSwriteInt(this,0xf03,(int *)local_34,cnt);
  piVar1 = (in_PATH->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(in_PATH->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  piVar2 = (in_PATH->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; (long)uVar5 >> 1 != uVar6; uVar6 = uVar6 + 1) {
    piVar7 = piVar2;
    if ((uVar6 & 1) == 0) {
      piVar7 = piVar1;
    }
    ((int *)((long)aiStack_68 + lVar4))[uVar6] = piVar7[uVar6 >> 1 & 0x7fffffff];
  }
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cd83;
  GDSwriteInt(this,0x1003,(int *)((long)aiStack_68 + lVar4),(uint)(uVar5 >> 1) & 0xfffffffe);
  if ((char)local_38 == '\0') {
    local_34[0] = in_PATH->propattr;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
    uVar3 = *(undefined8 *)((long)&uStack_70 + lVar4);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cda3;
    GDSwriteInt(this,0x2b02,(int *)local_34,(int)uVar3);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cdb6;
    std::__cxx11::string::string((string *)&local_60,(string *)&in_PATH->propvalue);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cdc6;
    GDSwriteStr(this,0x2c06,&local_60);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cdcf;
    std::__cxx11::string::~string((string *)&local_60);
  }
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cddc;
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsPath(const gdsPATH &in_PATH, bool minimal)
{
  int data[1];
  int corXY[in_PATH.xCor.size() * 2];

  this->GDSwriteRec(GDS_PATH);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_PATH.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_PATH.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  // unimportant, set to zero.
  data[0] = in_PATH.dataType;
  this->GDSwriteInt(GDS_DATATYPE, data, 1);

  data[0] = in_PATH.pathtype;
  this->GDSwriteInt(GDS_PATHTYPE, data, 1);

  // Width of tracks
  data[0] = in_PATH.width;
  this->GDSwriteInt(GDS_WIDTH, data, 1);

  // XY coordinates
  // boundary must be closed, first and last coordinate must be the same
  // minimum of 4 points(triangle)
  for (int i = 0; i < in_PATH.xCor.size() * 2; i++) {
    if (i % 2) {
      corXY[i] = in_PATH.yCor[i / 2];
    } else {
      corXY[i] = in_PATH.xCor[i / 2];
    }
  }

  this->GDSwriteInt(GDS_XY, corXY, in_PATH.xCor.size() * 2);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_PATH.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_PATH.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}